

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestMemCheckHandler.cxx
# Opt level: O0

char * __thiscall
cmBoundsCheckerParser::GetAttribute(cmBoundsCheckerParser *this,char *name,char **atts)

{
  int iVar1;
  int local_2c;
  int i;
  char **atts_local;
  char *name_local;
  cmBoundsCheckerParser *this_local;
  
  local_2c = 0;
  while( true ) {
    if (atts[local_2c] == (char *)0x0) {
      return (char *)0x0;
    }
    iVar1 = strcmp(name,atts[local_2c]);
    if (iVar1 == 0) break;
    local_2c = local_2c + 1;
  }
  return atts[local_2c + 1];
}

Assistant:

const char* GetAttribute(const char* name, const char** atts)
  {
    int i = 0;
    for (; atts[i] != nullptr; ++i) {
      if (strcmp(name, atts[i]) == 0) {
        return atts[i + 1];
      }
    }
    return nullptr;
  }